

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merkleblock.cpp
# Opt level: O1

vector<unsigned_char,_std::allocator<unsigned_char>_> *
BitsToBytes(vector<unsigned_char,_std::allocator<unsigned_char>_> *__return_storage_ptr__,
           vector<bool,_std::allocator<bool>_> *bits)

{
  byte *pbVar1;
  uint uVar2;
  _Bit_type *p_Var3;
  ulong uVar4;
  long in_FS_OFFSET;
  allocator_type local_19;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (__return_storage_ptr__,
             (long)(bits->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                   super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p +
             (((ulong)(bits->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                      super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset + 7 >> 3
              ) - (long)(bits->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                        super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p) &
             0x1fffffffffffffff,&local_19);
  p_Var3 = (bits->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
           _M_start.super__Bit_iterator_base._M_p;
  if (((long)(bits->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
             _M_finish.super__Bit_iterator_base._M_p - (long)p_Var3) * 8 +
      (ulong)(bits->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
             _M_finish.super__Bit_iterator_base._M_offset != 0) {
    uVar2 = 1;
    uVar4 = 0;
    do {
      pbVar1 = (__return_storage_ptr__->
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_start + (uVar2 - 1 >> 3);
      *pbVar1 = *pbVar1 | ((p_Var3[uVar4 >> 6] >> (uVar4 & 0x3f) & 1) != 0) <<
                          ((byte)(uVar2 - 1) & 7);
      uVar4 = (ulong)uVar2;
      p_Var3 = (bits->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
               _M_start.super__Bit_iterator_base._M_p;
      uVar2 = uVar2 + 1;
    } while (uVar4 < (ulong)(bits->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                            super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset +
                     ((long)(bits->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                            super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p -
                     (long)p_Var3) * 8);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::vector<unsigned char> BitsToBytes(const std::vector<bool>& bits)
{
    std::vector<unsigned char> ret((bits.size() + 7) / 8);
    for (unsigned int p = 0; p < bits.size(); p++) {
        ret[p / 8] |= bits[p] << (p % 8);
    }
    return ret;
}